

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_interface.cc
# Opt level: O0

void init_interface(module *m)

{
  class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *pcVar1;
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
  *this;
  class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *pcVar2;
  code *local_230;
  undefined8 local_228;
  code *local_220;
  undefined8 local_218;
  return_value_policy local_20d;
  type local_20c;
  return_value_policy local_20b;
  type local_20a;
  type local_209;
  code *local_208;
  undefined8 local_200;
  code *local_1f8;
  undefined8 local_1f0;
  return_value_policy local_1e4;
  type local_1e3;
  return_value_policy local_1e2;
  type local_1e1;
  PyObject *local_1e0;
  class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> local_1d8;
  class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_> ref;
  code *local_1c0;
  undefined8 local_1b8;
  PyObject *local_1b0;
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  local_1a8;
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>
  modport_interface;
  offset_in_Var_to_subr local_198 [4];
  code *local_178;
  undefined8 local_170;
  code *local_168;
  undefined8 local_160;
  code *local_158;
  undefined8 local_150;
  code *local_148;
  undefined8 local_140;
  offset_in_Var_to_subr local_130 [2];
  code *local_120;
  undefined8 local_118;
  offset_in_Var_to_subr local_108 [2];
  code *local_f8;
  undefined8 local_f0;
  offset_in_Var_to_subr local_e0 [2];
  code *local_d0;
  undefined8 local_c8;
  offset_in_Var_to_subr local_b8 [2];
  code *local_a8;
  undefined8 local_a0;
  offset_in_Var_to_subr local_90 [2];
  code *local_80;
  undefined8 local_78;
  offset_in_Var_to_subr local_68 [2];
  code *local_58;
  undefined8 local_50;
  code *local_48;
  undefined8 local_40;
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_21;
  PyObject *local_20;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> local_18;
  class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_> interface;
  module *m_local;
  
  local_20 = (m->super_object).super_handle.m_ptr;
  interface.super_generic_type.super_object.super_handle.m_ptr = (generic_type)(generic_type)m;
  pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
  class_<>(&local_18,(handle)local_20,"Interface");
  pybind11::init<std::__cxx11::string_const&>();
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string_const&>
                     ((class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>
                       *)&local_18,&local_21);
  local_48 = kratos::InterfaceDefinition::input;
  local_40 = 0;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar1,"input",(offset_in_Var_to_subr *)&local_48);
  local_58 = kratos::InterfaceDefinition::output;
  local_50 = 0;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar1,"output",(offset_in_Var_to_subr *)&local_58);
  local_80 = kratos::InterfaceDefinition::var;
  local_78 = 0;
  local_68[0] = pybind11::detail::
                overload_cast_impl<std::__cxx11::string_const&,unsigned_int,unsigned_int>::
                operator()(&pybind11::
                            overload_cast<std::__cxx11::string_const&,unsigned_int,unsigned_int>,
                           kratos::InterfaceDefinition::var,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int)>
                     (pcVar1,"var",local_68);
  local_a8 = kratos::InterfaceDefinition::var;
  local_a0 = 0;
  local_90[0] = pybind11::detail::
                overload_cast_impl<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                ::operator()(&pybind11::
                              overload_cast<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&>
                             ,kratos::InterfaceDefinition::var,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)>
                     (pcVar1,"var",local_90);
  local_d0 = kratos::InterfaceDefinition::var;
  local_c8 = 0;
  local_b8[0] = pybind11::detail::overload_cast_impl<std::__cxx11::string_const&,unsigned_int>::
                operator()(&pybind11::overload_cast<std::__cxx11::string_const&,unsigned_int>,
                           kratos::InterfaceDefinition::var,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int)>
                     (pcVar1,"var",local_b8);
  local_f8 = kratos::InterfaceDefinition::port;
  local_f0 = 0;
  local_e0[0] = pybind11::detail::
                overload_cast_impl<std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection>
                ::operator()(&pybind11::
                              overload_cast<std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection>
                             ,kratos::InterfaceDefinition::port,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,unsigned_int,kratos::PortDirection)>
                     (pcVar1,"port",local_e0);
  local_120 = kratos::InterfaceDefinition::port;
  local_118 = 0;
  local_108[0] = pybind11::detail::
                 overload_cast_impl<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection>
                 ::operator()(&pybind11::
                               overload_cast<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection>
                              ,kratos::InterfaceDefinition::port,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection)>
                     (pcVar1,"port",local_108);
  local_148 = kratos::InterfaceDefinition::port;
  local_140 = 0;
  local_130[0] = pybind11::detail::
                 overload_cast_impl<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection,kratos::PortType>
                 ::operator()(&pybind11::
                               overload_cast<std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection,kratos::PortType>
                              ,kratos::InterfaceDefinition::port,0);
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&,unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortDirection,kratos::PortType)>
                     (pcVar1,"port",local_130);
  local_158 = kratos::InterfaceDefinition::clock;
  local_150 = 0;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar1,"clock",(offset_in_Var_to_subr *)&local_158);
  local_168 = kratos::InterfaceDefinition::reset;
  local_160 = 0;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::__cxx11::string(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar1,"reset",(offset_in_Var_to_subr *)&local_168);
  local_178 = kratos::InterfaceDefinition::create_modport_def;
  local_170 = 0;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<std::shared_ptr<kratos::InterfaceModPortDefinition>(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)>
                     (pcVar1,"modport",(offset_in_Var_to_subr *)&local_178);
  local_198[3] = 0;
  local_198[2] = 9;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                     (pcVar1,"has_var",local_198 + 2);
  local_198[1] = 0;
  local_198[0] = 1;
  pcVar1 = (class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>> *)
           pybind11::
           class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
           def<bool(kratos::InterfaceDefinition::*)(std::__cxx11::string_const&)const>
                     (pcVar1,"has_port",local_198);
  pybind11::class_<kratos::InterfaceDefinition,std::shared_ptr<kratos::InterfaceDefinition>>::
  def<init_interface(pybind11::module_&)::__0>
            (pcVar1,"__contains__",
             (type *)((long)&modport_interface.super_generic_type.super_object.super_handle.m_ptr +
                     7));
  local_1b0 = *(PyObject **)interface.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>::
  class_<>(&local_1a8,(handle)local_1b0,"ModPortInterface");
  local_1c0 = kratos::InterfaceModPortDefinition::set_input;
  local_1b8 = 0;
  this = (class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
          *)pybind11::
            class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
            ::def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
                      ((class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>
                        *)&local_1a8,"set_input",(offset_in_Var_to_subr *)&local_1c0);
  ref.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::InterfaceModPortDefinition::set_output;
  pybind11::
  class_<kratos::InterfaceModPortDefinition,std::shared_ptr<kratos::InterfaceModPortDefinition>>::
  def<void(kratos::InterfaceModPortDefinition::*)(std::__cxx11::string_const&)>
            (this,"set_output",(offset_in_Var_to_subr *)&ref);
  local_1e0 = *(PyObject **)interface.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_>::class_<>
            (&local_1d8,(handle)local_1e0,"InterfaceRef");
  local_1e2 = reference;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<init_interface(pybind11::module_&)::__1,pybind11::return_value_policy>
                     ((class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
                      &local_1d8,"var",&local_1e1,&local_1e2);
  local_1e4 = reference;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<init_interface(pybind11::module_&)::__2,pybind11::return_value_policy>
                     (pcVar2,"port",&local_1e3,&local_1e4);
  local_1f8 = kratos::InterfaceRef::has_var;
  local_1f0 = 0;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     (pcVar2,"has_var",(offset_in_Var_to_subr *)&local_1f8);
  local_208 = kratos::InterfaceRef::has_port;
  local_200 = 0;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)const>
                     (pcVar2,"has_port",(offset_in_Var_to_subr *)&local_208);
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<init_interface(pybind11::module_&)::__3>(pcVar2,"__contains__",&local_209);
  local_20b = reference;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<init_interface(pybind11::module_&)::__4,pybind11::return_value_policy>
                     (pcVar2,"__getitem__",&local_20a,&local_20b);
  local_20d = reference;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<init_interface(pybind11::module_&)::__5,pybind11::return_value_policy>
                     (pcVar2,"__getattr__",&local_20c,&local_20d);
  local_220 = kratos::InterfaceRef::has_modport;
  local_218 = 0;
  pcVar2 = (class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>> *)
           pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
           def<bool(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
                     (pcVar2,"has_modport",(offset_in_Var_to_subr *)&local_220);
  local_230 = kratos::InterfaceRef::get_modport_ref;
  local_228 = 0;
  pybind11::class_<kratos::InterfaceRef,std::shared_ptr<kratos::InterfaceRef>>::
  def<std::shared_ptr<kratos::InterfaceRef>(kratos::InterfaceRef::*)(std::__cxx11::string_const&)>
            (pcVar2,"get_modport_ref",(offset_in_Var_to_subr *)&local_230);
  pybind11::class_<kratos::InterfaceRef,_std::shared_ptr<kratos::InterfaceRef>_>::~class_
            (&local_1d8);
  pybind11::
  class_<kratos::InterfaceModPortDefinition,_std::shared_ptr<kratos::InterfaceModPortDefinition>_>::
  ~class_(&local_1a8);
  pybind11::class_<kratos::InterfaceDefinition,_std::shared_ptr<kratos::InterfaceDefinition>_>::
  ~class_(&local_18);
  return;
}

Assistant:

void init_interface(py::module &m) {
    using namespace kratos;
    auto interface =
        py::class_<InterfaceDefinition, std::shared_ptr<InterfaceDefinition>>(m, "Interface");
    interface.def(py::init<const std::string &>())
        .def("input", &InterfaceDefinition::input)
        .def("output", &InterfaceDefinition::output)
        .def("var",
             py::overload_cast<const std::string &, uint32_t, uint32_t>(&InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &>(
                        &InterfaceDefinition::var))
        .def("var", py::overload_cast<const std::string &, uint32_t>(&InterfaceDefinition::var))
        .def("port", py::overload_cast<const std::string &, uint32_t, uint32_t, PortDirection>(
                         &InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection>(&InterfaceDefinition::port))
        .def("port", py::overload_cast<const std::string &, uint32_t, const std::vector<uint32_t> &,
                                       PortDirection, PortType>(&InterfaceDefinition::port))
        .def("clock", &InterfaceDefinition::clock)
        .def("reset", &InterfaceDefinition::reset)
        .def("modport", &InterfaceDefinition::create_modport_def)
        .def("has_var", &InterfaceDefinition::has_var)
        .def("has_port", &InterfaceDefinition::has_port)
        .def("__contains__", [](InterfaceDefinition &def, const std::string &name) {
            return def.has_port(name) || def.has_var(name);
        });

    auto modport_interface =
        py::class_<InterfaceModPortDefinition, std::shared_ptr<InterfaceModPortDefinition>>(
            m, "ModPortInterface");
    modport_interface.def("set_input", &InterfaceModPortDefinition::set_input)
        .def("set_output", &InterfaceModPortDefinition::set_output);

    auto ref = py::class_<InterfaceRef, std::shared_ptr<InterfaceRef>>(m, "InterfaceRef");
    ref.def(
           "var", [](InterfaceRef &ref, const std::string &name) -> Var & { return ref.var(name); },
           py::return_value_policy::reference)
        .def(
            "port",
            [](InterfaceRef &ref, const std::string &name) -> Port & { return ref.port(name); },
            py::return_value_policy::reference)
        .def("has_var", &InterfaceRef::has_var)
        .def("has_port", &InterfaceRef::has_port)
        .def("__contains__",
             [](InterfaceRef &ref, const std::string &name) {
                 return ref.has_port(name) || ref.has_var(name);
             })
        .def(
            "__getitem__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def(
            "__getattr__",
            [](InterfaceRef &ref, const std::string &name) -> Var * {
                if (ref.has_port(name)) {
                    return &ref.port(name);
                } else if (ref.has_var(name)) {
                    return &ref.var(name);
                } else if (name == "__len__") {
                    return nullptr;
                } else {
                    throw UserException(name + " not exist in " + ref.name());
                }
            },
            py::return_value_policy::reference)
        .def("has_modport", &InterfaceRef::has_modport)
        .def("get_modport_ref", &InterfaceRef::get_modport_ref);
}